

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int wb_consume(archive_write *a,size_t size)

{
  void *pvVar1;
  ulong in_RSI;
  archive_write *in_RDI;
  iso9660_conflict *iso9660;
  int local_4;
  
  pvVar1 = in_RDI->format_data;
  if ((*(ulong *)((long)pvVar1 + 0x102e0) < in_RSI) || (*(long *)((long)pvVar1 + 0x102e0) == 0)) {
    archive_set_error(&in_RDI->archive,-1,
                      "Internal Programing error: iso9660:wb_consume() size=%jd, wbuff_remaining=%jd"
                      ,in_RSI,*(undefined8 *)((long)pvVar1 + 0x102e0));
    local_4 = -0x1e;
  }
  else {
    *(ulong *)((long)pvVar1 + 0x102e0) = *(long *)((long)pvVar1 + 0x102e0) - in_RSI;
    if (*(ulong *)((long)pvVar1 + 0x102e0) < 0x800) {
      local_4 = wb_write_out(in_RDI);
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static int
wb_consume(struct archive_write *a, size_t size)
{
	struct iso9660 *iso9660 = (struct iso9660 *)a->format_data;

	if (size > iso9660->wbuff_remaining ||
	    iso9660->wbuff_remaining == 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Internal Programing error: iso9660:wb_consume()"
		    " size=%jd, wbuff_remaining=%jd",
		    (intmax_t)size, (intmax_t)iso9660->wbuff_remaining);
		return (ARCHIVE_FATAL);
	}
	iso9660->wbuff_remaining -= size;
	if (iso9660->wbuff_remaining < LOGICAL_BLOCK_SIZE)
		return (wb_write_out(a));
	return (ARCHIVE_OK);
}